

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O2

void rtp_rb_init(uint size)

{
  rtp_rb_destroy();
  rtp_rb = (rtp_pkt_t *)malloc((ulong)size * 0x628);
  if (rtp_rb != (rtp_pkt_t *)0x0) {
    rtp_rb_size = size;
    rtp_rb_clear();
    return;
  }
  __assert_fail("rtp_rb != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x42,
                "void rtp_rb_init(unsigned int)");
}

Assistant:

void rtp_rb_init(unsigned int size) {
  rtp_rb_destroy();

  rtp_rb = malloc(sizeof(rtp_pkt_t) * size);
  assert(rtp_rb != NULL);

  rtp_rb_size = size;
  rtp_rb_clear();
}